

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_object.cpp
# Opt level: O0

object_ptr __thiscall
mjs::make_array(mjs *this,gc_heap_ptr<mjs::global_object> *global,uint32_t length)

{
  undefined8 extraout_RDX;
  object_ptr oVar1;
  gc_heap_ptr<mjs::array_object> local_30;
  gc_heap_ptr_untracked<mjs::object,_true> local_1c;
  gc_heap_ptr<mjs::global_object> *pgStack_18;
  uint32_t length_local;
  gc_heap_ptr<mjs::global_object> *global_local;
  
  local_1c.pos_ = length;
  pgStack_18 = global;
  global_local = (gc_heap_ptr<mjs::global_object> *)this;
  array_object::make((array_object *)&local_30,global,length);
  gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::array_object,void>
            ((gc_heap_ptr<mjs::object> *)this,&local_30);
  gc_heap_ptr<mjs::array_object>::~gc_heap_ptr(&local_30);
  oVar1.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  oVar1.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (object_ptr)oVar1.super_gc_heap_ptr_untyped;
}

Assistant:

object_ptr make_array(const gc_heap_ptr<global_object>& global, uint32_t length) {
    return array_object::make(global, length);
}